

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t size;
  Vector *result_00;
  Vector *pVVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t i_1;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  lVar9 = 0;
  for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
    iVar7 = iVar6;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)(local_78.sel)->sel_vector[iVar6];
    }
    if (**(long **)(local_78.data + iVar7 * 8) != 0) {
      lVar9 = lVar9 + *(long *)(**(long **)(local_78.data + iVar7 * 8) + 0x20);
    }
  }
  ListVector::Reserve(result,lVar9 + size);
  result_00 = MapVector::GetKeys(result);
  pVVar4 = MapVector::GetValues(result);
  pdVar2 = result->data;
  pdVar3 = pVVar4->data;
  for (uVar8 = 0; uVar8 != count; uVar8 = uVar8 + 1) {
    uVar5 = uVar8;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)(local_78.sel)->sel_vector[uVar8];
    }
    lVar9 = **(long **)(local_78.data + uVar5 * 8);
    if (lVar9 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar8 + offset);
    }
    else {
      lVar10 = (uVar8 + offset) * 0x10;
      plVar1 = (long *)(pdVar2 + lVar10);
      *(idx_t *)(pdVar2 + lVar10) = size;
      plVar11 = (long *)(lVar9 + 0x18);
      while (plVar11 = (long *)*plVar11, plVar11 != (long *)0x0) {
        HistogramGenericFunctor::HistogramFinalize<duckdb::string_t>
                  ((string_t)((anon_union_16_2_67f50693_for_value *)(plVar11 + 1))->pointer,
                   result_00,size);
        *(long *)(pdVar3 + size * 8) = plVar11[3];
        size = size + 1;
      }
      plVar1[1] = size - *plVar1;
    }
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}